

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlText::Clone(TiXmlText *this)

{
  TiXmlText *this_00;
  size_t len;
  char *__s;
  
  this_00 = (TiXmlText *)operator_new(0x58);
  TiXmlText(this_00,"");
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(this_00->super_TiXmlNode).value,__s,len);
  (this_00->super_TiXmlNode).super_TiXmlBase.userData =
       (this->super_TiXmlNode).super_TiXmlBase.userData;
  this_00->cdata = this->cdata;
  return &this_00->super_TiXmlNode;
}

Assistant:

TiXmlNode* TiXmlText::Clone() const {
	TiXmlText* clone = 0;
	clone = new TiXmlText("");

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}